

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::CompilerGLSL(CompilerGLSL *this,uint32_t *ir_,size_t word_count)

{
  Compiler::Compiler(&this->super_Compiler,ir_,word_count);
  (this->super_Compiler)._vptr_Compiler = (_func_int **)&PTR__CompilerGLSL_0049ed30;
  this->current_emitting_block = (SPIRBlock *)0x0;
  (this->current_emitting_switch_stack).super_VectorView<spirv_cross::SPIRBlock_*>.ptr =
       (SPIRBlock **)0x0;
  (this->current_emitting_switch_stack).super_VectorView<spirv_cross::SPIRBlock_*>.buffer_size = 0;
  (this->current_emitting_switch_stack).buffer_capacity = 0;
  (this->current_emitting_switch_stack).super_VectorView<spirv_cross::SPIRBlock_*>.ptr =
       (SPIRBlock **)&(this->current_emitting_switch_stack).stack_storage;
  (this->current_emitting_switch_stack).buffer_capacity = 8;
  this->current_emitting_switch_fallthrough = false;
  (this->buffer).current_buffer.buffer = (char *)0x0;
  (this->buffer).current_buffer.offset = 0;
  (this->buffer).current_buffer.size = 0;
  (this->buffer).saved_buffers.super_VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.
  ptr = (Buffer *)0x0;
  (this->buffer).saved_buffers.super_VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.
  buffer_size = 0;
  (this->buffer).saved_buffers.super_VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>.
  ptr = (Buffer *)&(this->buffer).saved_buffers.stack_storage;
  (this->buffer).saved_buffers.buffer_capacity = 8;
  StringStream<4096UL,_4096UL>::reset(&this->buffer);
  this->block_temporary_hoisting = false;
  this->block_debug_directives = false;
  this->redirect_statement =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)0x0;
  this->current_continue_block = (SPIRBlock *)0x0;
  (this->options).version = 0x1c2;
  (this->options).es = false;
  (this->options).force_temporary = false;
  (this->options).force_recompile_max_debug_iterations = 3;
  (this->options).vulkan_semantics = false;
  (this->options).separate_shader_objects = false;
  (this->options).flatten_multidimensional_arrays = false;
  (this->options).enable_420pack_extension = true;
  (this->options).emit_push_constant_as_uniform_buffer = false;
  (this->options).emit_uniform_buffer_as_plain_uniforms = false;
  (this->options).emit_line_directives = false;
  (this->options).enable_storage_image_qualifier_deduction = true;
  (this->options).force_zero_initialized_variables = false;
  (this->options).force_flattened_io_blocks = false;
  (this->options).relax_nan_checks = false;
  (this->options).enable_row_major_load_workaround = true;
  (this->options).ovr_multiview_view_count = 0;
  (this->options).vertex.fixup_clipspace = false;
  (this->options).vertex.flip_vert_y = false;
  (this->options).vertex.support_nonzero_base_instance = true;
  (this->options).fragment.default_float_precision = Mediump;
  (this->options).fragment.default_int_precision = Highp;
  (this->local_variable_names)._M_h._M_buckets = &(this->local_variable_names)._M_h._M_single_bucket
  ;
  (this->local_variable_names)._M_h._M_bucket_count = 1;
  (this->local_variable_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->local_variable_names)._M_h._M_element_count = 0;
  (this->local_variable_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->local_variable_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->local_variable_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->resource_names)._M_h._M_buckets = &(this->resource_names)._M_h._M_single_bucket;
  (this->resource_names)._M_h._M_bucket_count = 1;
  (this->resource_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->resource_names)._M_h._M_element_count = 0;
  (this->resource_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_input_names)._M_h._M_buckets = &(this->block_input_names)._M_h._M_single_bucket;
  (this->block_input_names)._M_h._M_bucket_count = 1;
  (this->block_input_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_input_names)._M_h._M_element_count = 0;
  (this->block_input_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_input_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_input_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_output_names)._M_h._M_buckets = &(this->block_output_names)._M_h._M_single_bucket;
  (this->block_output_names)._M_h._M_bucket_count = 1;
  (this->block_output_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_output_names)._M_h._M_element_count = 0;
  (this->block_output_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_output_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_output_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_ubo_names)._M_h._M_buckets = &(this->block_ubo_names)._M_h._M_single_bucket;
  (this->block_ubo_names)._M_h._M_bucket_count = 1;
  (this->block_ubo_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_ubo_names)._M_h._M_element_count = 0;
  (this->block_ubo_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_ubo_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_ubo_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_ssbo_names)._M_h._M_buckets = &(this->block_ssbo_names)._M_h._M_single_bucket;
  (this->block_ssbo_names)._M_h._M_bucket_count = 1;
  (this->block_ssbo_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_ssbo_names)._M_h._M_element_count = 0;
  (this->block_ssbo_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_ssbo_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_ssbo_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_names)._M_h._M_buckets = &(this->block_names)._M_h._M_single_bucket;
  (this->block_names)._M_h._M_bucket_count = 1;
  (this->block_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_names)._M_h._M_element_count = 0;
  (this->block_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->function_overloads)._M_h._M_buckets = &(this->function_overloads)._M_h._M_single_bucket;
  (this->function_overloads)._M_h._M_bucket_count = 1;
  (this->function_overloads)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->function_overloads)._M_h._M_element_count = 0;
  (this->function_overloads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->function_overloads)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->function_overloads)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->preserved_aliases)._M_h._M_buckets = &(this->preserved_aliases)._M_h._M_single_bucket;
  (this->preserved_aliases)._M_h._M_bucket_count = 1;
  (this->preserved_aliases)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->preserved_aliases)._M_h._M_element_count = 0;
  (this->preserved_aliases)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->processing_entry_point = false;
  (this->preserved_aliases)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->preserved_aliases)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  BackendVariations::BackendVariations(&this->backend);
  this->indent = 0;
  (this->emitted_functions)._M_h._M_buckets = &(this->emitted_functions)._M_h._M_single_bucket;
  (this->emitted_functions)._M_h._M_bucket_count = 1;
  (this->emitted_functions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitted_functions)._M_h._M_element_count = 0;
  (this->emitted_functions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitted_functions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitted_functions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->flushed_phi_variables)._M_h._M_buckets =
       &(this->flushed_phi_variables)._M_h._M_single_bucket;
  (this->flushed_phi_variables)._M_h._M_bucket_count = 1;
  (this->flushed_phi_variables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flushed_phi_variables)._M_h._M_element_count = 0;
  (this->flushed_phi_variables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->flushed_phi_variables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flushed_phi_variables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->flattened_buffer_blocks)._M_h._M_buckets =
       &(this->flattened_buffer_blocks)._M_h._M_single_bucket;
  (this->flattened_buffer_blocks)._M_h._M_bucket_count = 1;
  (this->flattened_buffer_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flattened_buffer_blocks)._M_h._M_element_count = 0;
  (this->flattened_buffer_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->flattened_buffer_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flattened_buffer_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->flattened_structs)._M_h._M_buckets = &(this->flattened_structs)._M_h._M_single_bucket;
  (this->flattened_structs)._M_h._M_bucket_count = 1;
  (this->flattened_structs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flattened_structs)._M_h._M_element_count = 0;
  (this->flattened_structs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->shader_subgroup_supporter).feature_mask = 0;
  (this->flattened_structs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flattened_structs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->expression_usage_counts)._M_h._M_buckets =
       &(this->expression_usage_counts)._M_h._M_single_bucket;
  (this->expression_usage_counts)._M_h._M_bucket_count = 1;
  (this->expression_usage_counts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->expression_usage_counts)._M_h._M_element_count = 0;
  (this->expression_usage_counts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->forced_extensions).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->forced_extensions).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  (this->expression_usage_counts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->expression_usage_counts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->forced_extensions).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(this->forced_extensions).stack_storage;
  (this->forced_extensions).buffer_capacity = 8;
  (this->header_lines).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->header_lines).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  (this->header_lines).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(this->header_lines).stack_storage;
  (this->header_lines).buffer_capacity = 8;
  (this->extra_sub_expressions)._M_h._M_buckets =
       &(this->extra_sub_expressions)._M_h._M_single_bucket;
  (this->extra_sub_expressions)._M_h._M_bucket_count = 1;
  (this->extra_sub_expressions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extra_sub_expressions)._M_h._M_element_count = 0;
  (this->extra_sub_expressions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extra_sub_expressions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extra_sub_expressions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->workaround_ubo_load_overload_types).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)0x0;
  (this->workaround_ubo_load_overload_types).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size = 0;
  (this->workaround_ubo_load_overload_types).buffer_capacity = 0;
  (this->workaround_ubo_load_overload_types).
  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr =
       (TypedID<(spirv_cross::Types)1> *)&(this->workaround_ubo_load_overload_types).stack_storage;
  (this->workaround_ubo_load_overload_types).buffer_capacity = 8;
  *(undefined8 *)((long)&this->required_polyfills + 2) = 0;
  this->statement_count = 0;
  this->required_polyfills = 0;
  (this->inout_color_attachments).
  super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inout_color_attachments).
  super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subpass_to_framebuffer_fetch_attachment).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inout_color_attachments).
  super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subpass_to_framebuffer_fetch_attachment).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subpass_to_framebuffer_fetch_attachment).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pls_outputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pls_outputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pls_inputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pls_outputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pls_inputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pls_inputs).
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_buckets =
       &(this->temporary_to_mirror_precision_alias)._M_h._M_single_bucket;
  (this->temporary_to_mirror_precision_alias)._M_h._M_bucket_count = 1;
  (this->temporary_to_mirror_precision_alias)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_element_count = 0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->composite_insert_overwritten)._M_h._M_buckets =
       &(this->composite_insert_overwritten)._M_h._M_single_bucket;
  (this->composite_insert_overwritten)._M_h._M_bucket_count = 1;
  (this->composite_insert_overwritten)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->composite_insert_overwritten)._M_h._M_element_count = 0;
  (this->composite_insert_overwritten)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->composite_insert_overwritten)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->composite_insert_overwritten)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_composite_insert_overwrite)._M_h._M_buckets =
       &(this->block_composite_insert_overwrite)._M_h._M_single_bucket;
  (this->block_composite_insert_overwrite)._M_h._M_bucket_count = 1;
  (this->block_composite_insert_overwrite)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_composite_insert_overwrite)._M_h._M_element_count = 0;
  (this->block_composite_insert_overwrite)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_composite_insert_overwrite)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_composite_insert_overwrite)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->current_locale_radix_character = '.';
  (this->masked_output_locations)._M_h._M_buckets =
       &(this->masked_output_locations)._M_h._M_single_bucket;
  (this->masked_output_locations)._M_h._M_bucket_count = 1;
  (this->masked_output_locations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->masked_output_locations)._M_h._M_element_count = 0;
  (this->masked_output_locations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->masked_output_locations)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->masked_output_locations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->masked_output_builtins)._M_h._M_buckets =
       &(this->masked_output_builtins)._M_h._M_single_bucket;
  (this->masked_output_builtins)._M_h._M_bucket_count = 1;
  (this->masked_output_builtins)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->masked_output_builtins)._M_h._M_element_count = 0;
  (this->masked_output_builtins)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  this->float_formatter = (FloatFormatter *)0x0;
  (this->masked_output_builtins)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->masked_output_builtins)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->const_composite_insert_ids)._M_h._M_buckets =
       &(this->const_composite_insert_ids)._M_h._M_single_bucket;
  (this->const_composite_insert_ids)._M_h._M_bucket_count = 1;
  (this->const_composite_insert_ids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->const_composite_insert_ids)._M_h._M_element_count = 0;
  (this->const_composite_insert_ids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->const_composite_insert_ids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->const_composite_insert_ids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  init(this,(EVP_PKEY_CTX *)ir_);
  return;
}

Assistant:

CompilerGLSL(const uint32_t *ir_, size_t word_count)
	    : Compiler(ir_, word_count)
	{
		init();
	}